

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall ON_AngularDimension2Extra::CopyFrom(ON_AngularDimension2Extra *this,ON_Object *src)

{
  ON_UserData *pOVar1;
  bool bVar2;
  ON_UserData *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_UserData *)0x0;
  }
  else {
    bVar2 = ON_Object::IsKindOf(src,&m_ON_AngularDimension2Extra_class_rtti);
    src_00 = (ON_UserData *)0x0;
    if (bVar2) {
      src_00 = (ON_UserData *)src;
    }
  }
  if (src_00 != (ON_UserData *)0x0) {
    ON_UserData::operator=(&this->super_ON_UserData,src_00);
    pOVar1 = src_00[1].super_ON_Object.m_userdata_list;
    this->m_dimpoint_offset[0] = (double)src_00[1].super_ON_Object._vptr_ON_Object;
    this->m_dimpoint_offset[1] = (double)pOVar1;
  }
  return src_00 != (ON_UserData *)0x0;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}